

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O3

void * __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_PreWorker>::neighborSetOf
          (STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_PreWorker> *this,
          int idx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer piVar4;
  int to;
  int local_2c;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  
  iVar3 = (*(this->super_PreWorker).super_KDefectiveBase._vptr_KDefectiveBase[9])();
  this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            CONCAT44(extraout_var,iVar3);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             this_00);
  pvVar1 = (this->super_PreWorker).super_KDefectiveBase.from;
  piVar4 = pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = pvVar1[idx].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar4 != piVar2) {
    do {
      local_2c = *piVar4;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_00,&local_2c);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar2);
  }
  return this_00;
}

Assistant:

void* STLSetImplement<Set, Base>::neighborSetOf(int idx) {
	Set *__ptr__ = (Set*) newSet();
	__ptr__ -> clear();
	for (auto to: from[idx]) __ptr__ -> insert(to);
	return __ptr__;
}